

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeRollback(Btree *p,int tripCode,int writeOnly)

{
  BtShared *pBt;
  undefined4 in_EAX;
  int iVar1;
  int extraout_EAX;
  undefined4 in_register_00000004;
  MemPage *pPage1;
  
  pPage1 = (MemPage *)CONCAT44(in_register_00000004,in_EAX);
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  if (tripCode == 0) {
    writeOnly = 0;
    tripCode = saveAllCursors(pBt,0,(BtCursor *)0x0);
    if (tripCode == 0) goto LAB_00119b34;
  }
  sqlite3BtreeTripAllCursors(p,tripCode,writeOnly);
LAB_00119b34:
  if (p->inTrans == '\x02') {
    sqlite3PagerRollback(pBt->pPager);
    iVar1 = btreeGetPage(pBt,1,&pPage1,0);
    if (iVar1 == 0) {
      btreeSetNPage(pBt,pPage1);
      releasePageOne(pPage1);
    }
    pBt->inTransaction = '\x01';
    btreeClearHasContent(pBt);
  }
  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeRollback(Btree *p, int tripCode, int writeOnly){
  int rc;
  BtShared *pBt = p->pBt;
  MemPage *pPage1;

  assert( writeOnly==1 || writeOnly==0 );
  assert( tripCode==SQLITE_ABORT_ROLLBACK || tripCode==SQLITE_OK );
  sqlite3BtreeEnter(p);
  if( tripCode==SQLITE_OK ){
    rc = tripCode = saveAllCursors(pBt, 0, 0);
    if( rc ) writeOnly = 0;
  }else{
    rc = SQLITE_OK;
  }
  if( tripCode ){
    int rc2 = sqlite3BtreeTripAllCursors(p, tripCode, writeOnly);
    assert( rc==SQLITE_OK || (writeOnly==0 && rc2==SQLITE_OK) );
    if( rc2!=SQLITE_OK ) rc = rc2;
  }
  btreeIntegrity(p);

  if( p->inTrans==TRANS_WRITE ){
    int rc2;

    assert( TRANS_WRITE==pBt->inTransaction );
    rc2 = sqlite3PagerRollback(pBt->pPager);
    if( rc2!=SQLITE_OK ){
      rc = rc2;
    }

    /* The rollback may have destroyed the pPage1->aData value.  So
    ** call btreeGetPage() on page 1 again to make
    ** sure pPage1->aData is set correctly. */
    if( btreeGetPage(pBt, 1, &pPage1, 0)==SQLITE_OK ){
      btreeSetNPage(pBt, pPage1);
      releasePageOne(pPage1);
    }
    assert( countValidCursors(pBt, 1)==0 );
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return rc;
}